

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::setValue<bool>
          (TypedConfigurations *this,Level level,bool *value,
          map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
          *confMap,bool includeGlobalLevel)

{
  byte bVar1;
  bool bVar2;
  pair<el::Level,_bool> pVar3;
  pointer ppVar4;
  mapped_type_conflict *pmVar5;
  pair<el::Level,_bool> *in_RCX;
  byte *in_RDX;
  byte in_R8B;
  iterator it;
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *in_stack_ffffffffffffff58;
  pair<el::Level,_bool> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 uVar6;
  key_type *in_stack_ffffffffffffff78;
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *in_stack_ffffffffffffff80;
  _Self local_68;
  _Base_ptr local_60;
  _Self local_58;
  undefined4 local_4c;
  _Self local_48 [3];
  undefined4 local_30;
  Level local_2c;
  undefined1 local_28;
  byte local_21;
  pair<el::Level,_bool> *local_20;
  byte *local_18;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar2 = utils::std::
          map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
          ::empty((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                   *)0x278edf);
  if ((bVar2) && ((local_21 & 1) != 0)) {
    local_30 = 1;
    pVar3 = std::make_pair<el::Level,bool_const&>
                      ((Level *)in_stack_ffffffffffffff58,(bool *)0x278f16);
    local_2c = pVar3.first;
    local_28 = pVar3.second;
    std::map<el::Level,bool,std::less<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>::
    insert<std::pair<el::Level,bool>>
              ((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
  }
  else {
    local_4c = 1;
    local_48[0]._M_node =
         (_Base_ptr)
         utils::std::
         map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
         ::find(in_stack_ffffffffffffff58,(key_type *)0x278f5e);
    local_58._M_node =
         (_Base_ptr)
         utils::std::
         map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
         ::end(in_stack_ffffffffffffff58);
    bVar2 = utils::std::operator!=(local_48,&local_58);
    uVar6 = false;
    if (bVar2) {
      ppVar4 = utils::std::_Rb_tree_iterator<std::pair<const_el::Level,_bool>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_el::Level,_bool>_> *)0x278f9d);
      uVar6 = (ppVar4->second & 1U) == (*local_18 & 1);
    }
    if ((bool)uVar6 == false) {
      local_60 = (_Base_ptr)
                 utils::std::
                 map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                 ::find(in_stack_ffffffffffffff58,(key_type *)0x278fe2);
      local_48[0]._M_node = local_60;
      local_68._M_node =
           (_Base_ptr)
           utils::std::
           map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
           ::end(in_stack_ffffffffffffff58);
      bVar2 = utils::std::operator==(local_48,&local_68);
      if (bVar2) {
        std::make_pair<el::Level&,bool_const&>((Level *)in_stack_ffffffffffffff58,(bool *)0x27903a);
        std::
        map<el::Level,bool,std::less<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>::
        insert<std::pair<el::Level,bool>>
                  ((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                    *)CONCAT17(uVar6,in_stack_ffffffffffffff70),local_20);
      }
      else {
        bVar1 = *local_18;
        pmVar5 = utils::std::
                 map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                 ::at(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        *pmVar5 = (mapped_type_conflict)(bVar1 & 1);
      }
    }
  }
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::map<Level, Conf_T>* confMap, bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }